

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O0

ggml_backend_t ggml_backend_init_best(void)

{
  ggml_backend_dev_t dev;
  undefined8 local_10;
  undefined8 in_stack_fffffffffffffff8;
  ggml_backend_dev_type type;
  ggml_backend_t pgVar1;
  
  type = (ggml_backend_dev_type)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  local_10 = ggml_backend_dev_by_type(type);
  if (local_10 == (ggml_backend_dev_t)0x0) {
    local_10 = ggml_backend_dev_by_type(type);
  }
  if (local_10 == (ggml_backend_dev_t)0x0) {
    pgVar1 = (ggml_backend_t)0x0;
  }
  else {
    pgVar1 = (ggml_backend_t)ggml_backend_dev_init(local_10,0);
  }
  return pgVar1;
}

Assistant:

ggml_backend_t ggml_backend_init_best(void) {
    ggml_backend_dev_t dev = ggml_backend_dev_by_type(GGML_BACKEND_DEVICE_TYPE_GPU);
    if (!dev) {
        dev = ggml_backend_dev_by_type(GGML_BACKEND_DEVICE_TYPE_CPU);
    }
    if (!dev) {
        return nullptr;
    }
    return ggml_backend_dev_init(dev, nullptr);
}